

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

time_type get_henson_timer(string *name)

{
  bool bVar1;
  time_type tVar2;
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  timer(&local_78,&local_38);
  bVar1 = henson::exists(&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,(string *)name);
    timer(&sStack_98,&local_58);
    tVar2 = load_time(&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    tVar2 = 0;
  }
  return tVar2;
}

Assistant:

h::time_type    get_henson_timer(std::string name)
{
    if (!henson::exists(timer(name))) return 0;
    return load_time(timer(name));
}